

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O2

void legacy::checkSecondarySlicingCrit
               (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                *criteria_nodes,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *secondaryControlCriteria,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *secondaryDataCriteria,LLVMNode *nd)

{
  bool bVar1;
  LLVMNode *local_20;
  
  local_20 = nd;
  bVar1 = isCallTo(nd,secondaryControlCriteria);
  if (bVar1) {
    std::
    _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
    ::_M_insert_unique<dg::LLVMNode*const&>
              ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                *)criteria_nodes,&local_20);
    nd = local_20;
  }
  bVar1 = isCallTo(nd,secondaryDataCriteria);
  if (bVar1) {
    std::
    _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
    ::_M_insert_unique<dg::LLVMNode*const&>
              ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                *)criteria_nodes,&local_20);
  }
  return;
}

Assistant:

static inline void
checkSecondarySlicingCrit(std::set<LLVMNode *> &criteria_nodes,
                          const std::set<std::string> &secondaryControlCriteria,
                          const std::set<std::string> &secondaryDataCriteria,
                          LLVMNode *nd) {
    if (isCallTo(nd, secondaryControlCriteria))
        criteria_nodes.insert(nd);
    if (isCallTo(nd, secondaryDataCriteria)) {
        // XXX: Not fully supported, so add it...

        // static std::set<LLVMNode *> reported;
        // if (reported.insert(nd).second) {
        //     llvm::errs()
        //             << "WARNING: Found possible data secondary slicing
        //             criterion: "
        //             << *nd->getValue() << "\n";
        //     llvm::errs() << "This is not fully supported, so adding to be
        //     sound\n";
        // }
        criteria_nodes.insert(nd);
    }
}